

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

bool check_interaction_settings_collision(options_i *options,string *file_options)

{
  int iVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"q","");
  iVar1 = (*options->_vptr_options_i[1])(options,(string *)local_50);
  cVar3 = '\x01';
  if ((char)iVar1 == '\0') {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"quadratic","");
    iVar1 = (*options->_vptr_options_i[1])(options,local_70);
    cVar3 = '\x01';
    if ((char)iVar1 == '\0') {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"cubic","");
      iVar1 = (*options->_vptr_options_i[1])(options,local_b0);
      cVar3 = '\x01';
      if ((char)iVar1 == '\0') {
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"interactions","");
        iVar1 = (*options->_vptr_options_i[1])(options,local_90);
        cVar3 = (char)iVar1;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (cVar3 == '\0') {
    bVar4 = false;
  }
  else {
    lVar2 = std::__cxx11::string::find((char *)file_options,0x27b749,0);
    bVar4 = true;
    if ((lVar2 == -1) &&
       (lVar2 = std::__cxx11::string::find((char *)file_options,0x27b755,0), lVar2 == -1)) {
      lVar2 = std::__cxx11::string::find((char *)file_options,0x27b75d,0);
      bVar4 = lVar2 != -1;
    }
  }
  return bVar4;
}

Assistant:

bool check_interaction_settings_collision(options_i& options, std::string file_options)
{
  bool command_line_has_interaction = options.was_supplied("q") || options.was_supplied("quadratic") ||
      options.was_supplied("cubic") || options.was_supplied("interactions");

  if (!command_line_has_interaction)
    return false;

  // we don't use -q to save pairs in all.file_options, so only 3 options checked
  bool file_options_has_interaction = file_options.find("--quadratic") != std::string::npos;
  file_options_has_interaction = file_options_has_interaction || (file_options.find("--cubic") != std::string::npos);
  file_options_has_interaction =
      file_options_has_interaction || (file_options.find("--interactions") != std::string::npos);

  return file_options_has_interaction;
}